

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O2

StringTree * capnp::prettyPrint(Builder value)

{
  Reader value_00;
  StringTree *in_RDI;
  Reader local_48;
  
  DynamicStruct::Builder::asReader(&local_48,(Builder *)&stack0x00000008);
  value_00.reader.segment = local_48.reader.segment;
  value_00.schema.super_Schema.raw = local_48.schema.super_Schema.raw;
  value_00.reader.capTable = local_48.reader.capTable;
  value_00.reader.data = local_48.reader.data;
  value_00.reader.pointers = local_48.reader.pointers;
  value_00.reader.dataSize = local_48.reader.dataSize;
  value_00.reader.pointerCount = local_48.reader.pointerCount;
  value_00.reader._38_2_ = local_48.reader._38_2_;
  value_00.reader.nestingLimit = local_48.reader.nestingLimit;
  value_00.reader._44_4_ = local_48.reader._44_4_;
  prettyPrint(value_00);
  return in_RDI;
}

Assistant:

kj::StringTree prettyPrint(DynamicStruct::Builder value) { return prettyPrint(value.asReader()); }